

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

int __thiscall
btGeneric6DofConstraint::setAngularLimits
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,int row_offset,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  btScalar *pbVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  btVector3 axis;
  
  bVar4 = 9;
  lVar5 = 0x4d8;
  lVar6 = 0x37c;
  do {
    if ((*(int *)((long)this + lVar5 * 4 + -0xfac) != 0) ||
       (*(char *)((long)this + lVar5 * 4 + -0xfb8) != '\0')) {
      pbVar1 = (btScalar *)((long)((this->m_frameInA).m_basis.m_el + -5) + lVar5);
      axis.m_floats._0_8_ = *(undefined8 *)pbVar1;
      axis.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 2);
      uVar2 = this->m_flags >> (bVar4 & 0x1f);
      if ((uVar2 & 1) == 0) {
        *(btScalar *)((long)this + lVar5 * 4 + -0xfc8) = *info->cfm;
      }
      if ((uVar2 & 2) == 0) {
        *(btScalar *)((long)this + lVar5 * 4 + -0xfc0) = *info->cfm;
      }
      if ((uVar2 & 4) == 0) {
        *(btScalar *)((long)this + lVar5 * 4 + -0xfc4) = info->erp;
      }
      iVar3 = get_limit_motor_info2
                        (this,(btRotationalLimitMotor *)
                              ((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar6 + -0x48),
                         transA,transB,linVelA,linVelB,angVelA,angVelB,info,row_offset,&axis,1,0);
      row_offset = iVar3 + row_offset;
    }
    bVar4 = bVar4 + 3;
    lVar5 = lVar5 + 0x10;
    lVar6 = lVar6 + 0x40;
  } while (lVar5 != 0x508);
  return row_offset;
}

Assistant:

int btGeneric6DofConstraint::setAngularLimits(btConstraintInfo2 *info, int row_offset, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	btGeneric6DofConstraint * d6constraint = this;
	int row = row_offset;
	//solve angular limits
	for (int i=0;i<3 ;i++ )
	{
		if(d6constraint->getRotationalLimitMotor(i)->needApplyTorques())
		{
			btVector3 axis = d6constraint->getAxis(i);
			int flags = m_flags >> ((i + 3) * BT_6DOF_FLAGS_AXIS_SHIFT);
			if(!(flags & BT_6DOF_FLAGS_CFM_NORM))
			{
				m_angularLimits[i].m_normalCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_CFM_STOP))
			{
				m_angularLimits[i].m_stopCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_STOP))
			{
				m_angularLimits[i].m_stopERP = info->erp;
			}
			row += get_limit_motor_info2(d6constraint->getRotationalLimitMotor(i),
												transA,transB,linVelA,linVelB,angVelA,angVelB, info,row,axis,1);
		}
	}

	return row;
}